

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

int proxy_open(proxy_handle *ph)

{
  long *plVar1;
  void *pvVar2;
  char *pcVar3;
  int local_28;
  uint local_24;
  int ret;
  int i;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  plVar1 = (long *)ph->priv;
  conn_port_to_str((ph->conf).port,(char *)(plVar1 + 0x112));
  *(uint *)(plVar1 + 0x107) = (ph->conf).bind_addr_ext_add_len + 1;
  pvVar2 = calloc((long)(int)plVar1[0x107],0x48);
  *plVar1 = (long)pvVar2;
  if (*plVar1 == 0) {
    return -0xc;
  }
  pvVar2 = calloc((long)(int)plVar1[0x107],0x50);
  plVar1[0x103] = (long)pvVar2;
  if (plVar1[0x103] == 0) {
    local_28 = -0xc;
  }
  else {
    local_28 = log_open((log_handle *)(plVar1 + 0x10c));
    if (-1 < local_28) {
      if ((ph->conf).calls_allowed == (char *)0x0) {
        if (plVar1[0x105] != 0) {
          regex_free((regex_handle *)plVar1[0x105]);
          free((void *)plVar1[0x105]);
          plVar1[0x105] = 0;
        }
      }
      else {
        if (plVar1[0x105] == 0) {
          pvVar2 = calloc(1,8);
          plVar1[0x105] = (long)pvVar2;
          if (plVar1[0x105] == 0) {
            local_28 = -0xc;
            goto LAB_00106587;
          }
          local_28 = regex_init((regex_handle *)plVar1[0x105]);
          if (local_28 < 0) {
            pcVar3 = strerror(-local_28);
            proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize allowed callsigns regex (%d): %s\n",
                      (ulong)(uint)-local_28,pcVar3);
            goto LAB_00106587;
          }
        }
        local_28 = regex_compile((regex_handle *)plVar1[0x105],(ph->conf).calls_allowed);
        if (local_28 < 0) {
          pcVar3 = strerror(-local_28);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to compile allowed callsigns regex (%d): %s\n",
                    (ulong)(uint)-local_28,pcVar3);
          goto LAB_00106587;
        }
      }
      if ((ph->conf).calls_denied == (char *)0x0) {
        if (plVar1[0x106] != 0) {
          regex_free((regex_handle *)plVar1[0x106]);
          free((void *)plVar1[0x106]);
          plVar1[0x106] = 0;
        }
      }
      else {
        if (plVar1[0x106] == 0) {
          pvVar2 = calloc(1,8);
          plVar1[0x106] = (long)pvVar2;
          if (plVar1[0x106] == 0) {
            local_28 = -0xc;
            goto LAB_00106587;
          }
          local_28 = regex_init((regex_handle *)plVar1[0x106]);
          if (local_28 < 0) {
            pcVar3 = strerror(-local_28);
            proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize denied callsigns regex (%d): %s\n",
                      (ulong)(uint)-local_28,pcVar3);
            goto LAB_00106587;
          }
        }
        local_28 = regex_compile((regex_handle *)plVar1[0x106],(ph->conf).calls_denied);
        if (local_28 < 0) {
          pcVar3 = strerror(-local_28);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to compile denied callsigns regex (%d): %s\n",
                    (ulong)(uint)-local_28,pcVar3);
          goto LAB_00106587;
        }
      }
      memset(plVar1 + 3,0,0x800);
      *(char **)(*plVar1 + 0x10) = (ph->conf).bind_addr_ext;
      *(long **)(*plVar1 + 0x30) = plVar1 + 1;
      plVar1[1] = *plVar1;
      for (local_24 = 1; (int)local_24 < (int)plVar1[0x107]; local_24 = local_24 + 1) {
        *(char **)(*plVar1 + (long)(int)local_24 * 0x48 + 0x10) =
             (ph->conf).bind_addr_ext_add[(int)(local_24 + -1)];
        *(undefined8 *)(*plVar1 + (long)(int)local_24 * 0x48 + 0x40) = 0;
        *(undefined8 *)(*plVar1 + (long)(int)local_24 * 0x48 + 0x38) = 0;
        *(long *)(*plVar1 + (long)(int)(local_24 + -1) * 0x48 + 0x28) =
             *plVar1 + (long)(int)local_24 * 0x48;
        *(long *)(*plVar1 + (long)(int)local_24 * 0x48 + 0x30) =
             *plVar1 + (long)(int)(local_24 + -1) * 0x48 + 0x28;
      }
      *(undefined8 *)(*plVar1 + (long)(int)(local_24 + -1) * 0x48 + 0x28) = 0;
      plVar1[2] = *plVar1 + (long)(int)(local_24 + -1) * 0x48 + 0x28;
      for (local_24 = 0; (int)local_24 < (int)plVar1[0x107]; local_24 = local_24 + 1) {
        *(char **)(*plVar1 + (long)(int)local_24 * 0x48 + 0x18) = "5199";
        *(char **)(*plVar1 + (long)(int)local_24 * 0x48 + 0x20) = "5198";
        *(proxy_handle **)(*plVar1 + (long)(int)local_24 * 0x48 + 8) = ph;
        local_28 = proxy_conn_init((proxy_conn_handle *)(*plVar1 + (long)(int)local_24 * 0x48));
        if (local_28 < 0) {
          pcVar3 = strerror(-local_28);
          proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy connection #%d (%d): %s\n",
                    (ulong)local_24,(ulong)(uint)-local_28,pcVar3);
          while (local_24 = local_24 - 1, -1 < (int)local_24) {
            proxy_conn_free((proxy_conn_handle *)(*plVar1 + (long)(int)local_24 * 0x48));
          }
          goto LAB_00106587;
        }
      }
      local_24 = 0;
LAB_001062df:
      if ((int)local_24 < (int)plVar1[0x107]) {
        *(proxy_handle **)(plVar1[0x103] + (long)(int)local_24 * 0x50) = ph;
        local_28 = proxy_worker_init((proxy_worker *)(plVar1[0x103] + (long)(int)local_24 * 0x50));
        if (-1 < local_28) goto LAB_001063ab;
        pcVar3 = strerror(-local_28);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to initialize proxy client worker #%d (%d): %s\n",
                  (ulong)local_24,(ulong)(uint)-local_28,pcVar3);
        while (local_24 = local_24 - 1, -1 < (int)local_24) {
          proxy_worker_free((proxy_worker *)(plVar1[0x103] + (long)(int)local_24 * 0x50));
        }
      }
      else {
        plVar1[0x109] = (long)(ph->conf).bind_addr;
        plVar1[0x10a] = (long)(plVar1 + 0x112);
        local_28 = conn_listen((conn_handle *)(plVar1 + 0x108));
        if (-1 < local_28) {
          if ((ph->conf).bind_addr == (char *)0x0) {
            proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections on port %s\n",plVar1 + 0x112);
          }
          else {
            proxy_log(ph,LOG_LEVEL_INFO,"Listening for connections at %s:%s\n",(ph->conf).bind_addr,
                      plVar1 + 0x112);
          }
          return 0;
        }
        pcVar3 = strerror(-local_28);
        proxy_log(ph,LOG_LEVEL_FATAL,"Failed to open listening port (%d): %s\n",
                  (ulong)(uint)-local_28,pcVar3);
        plVar1[0x104] = 0;
        for (local_24 = 0; (int)local_24 < (int)plVar1[0x107]; local_24 = local_24 + 1) {
          proxy_worker_free((proxy_worker *)(plVar1[0x103] + (long)(int)local_24 * 0x50));
        }
      }
      plVar1[1] = 0;
      plVar1[2] = 0;
      for (local_24 = 0; (int)local_24 < (int)plVar1[0x107]; local_24 = local_24 + 1) {
        proxy_conn_free((proxy_conn_handle *)(*plVar1 + (long)(int)local_24 * 0x48));
      }
    }
  }
LAB_00106587:
  if (plVar1[0x105] != 0) {
    regex_free((regex_handle *)plVar1[0x105]);
    free((void *)plVar1[0x105]);
    plVar1[0x105] = 0;
  }
  log_close((log_handle *)(plVar1 + 0x10c));
  free((void *)plVar1[0x103]);
  plVar1[0x103] = 0;
  free((void *)*plVar1);
  *plVar1 = 0;
  *(undefined4 *)(plVar1 + 0x107) = 0;
  return local_28;
LAB_001063ab:
  *(long *)(plVar1[0x103] + (long)(int)local_24 * 0x50 + 0x10) = plVar1[0x104];
  plVar1[0x104] = plVar1[0x103] + (long)(int)local_24 * 0x50;
  local_24 = local_24 + 1;
  goto LAB_001062df;
}

Assistant:

int proxy_open(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	conn_port_to_str(ph->conf.port, priv->port_str);

	priv->num_clients = 1 + ph->conf.bind_addr_ext_add_len;

	priv->clients = calloc(priv->num_clients, sizeof(*priv->clients));
	if (priv->clients == NULL)
		return -ENOMEM;

	priv->client_workers = calloc(priv->num_clients,
				      sizeof(struct proxy_worker));
	if (priv->client_workers == NULL) {
		ret = -ENOMEM;
		goto proxy_open_exit;
	}

	ret = log_open(&priv->log);
	if (ret < 0)
		goto proxy_open_exit;

	if (ph->conf.calls_allowed != NULL) {
		if (priv->re_calls_allowed == NULL) {
			priv->re_calls_allowed = calloc(1,
				sizeof(*priv->re_calls_allowed));
			if (priv->re_calls_allowed == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_allowed);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize allowed callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_allowed,
				    ph->conf.calls_allowed);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile allowed callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	if (ph->conf.calls_denied != NULL) {
		if (priv->re_calls_denied == NULL) {
			priv->re_calls_denied = calloc(1,
				sizeof(*priv->re_calls_denied));
			if (priv->re_calls_denied == NULL) {
				ret = -ENOMEM;
				goto proxy_open_exit;
			}

			ret = regex_init(priv->re_calls_denied);
			if (ret < 0) {
				proxy_log(ph, LOG_LEVEL_FATAL,
					  "Failed to initialize denied callsigns regex (%d): %s\n",
					  -ret, strerror(-ret));
				goto proxy_open_exit;
			}
		}

		ret = regex_compile(priv->re_calls_denied,
				    ph->conf.calls_denied);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to compile denied callsigns regex (%d): %s\n",
				  -ret, strerror(-ret));
			goto proxy_open_exit;
		}
	} else if (priv->re_calls_denied != NULL) {
		regex_free(priv->re_calls_denied);
		free(priv->re_calls_denied);
		priv->re_calls_denied = NULL;
	}

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));

	priv->clients[0].source_addr = ph->conf.bind_addr_ext;

	priv->clients[0].prev_ptr = &priv->idle_clients_head;
	priv->idle_clients_head = &priv->clients[0];

	for (i = 1; i < priv->num_clients; i++) {
		priv->clients[i].source_addr = ph->conf.bind_addr_ext_add[i - 1];
		priv->clients[i].prev_by_call_ptr = NULL;
		priv->clients[i].next_by_call = NULL;
		priv->clients[i - 1].next = &priv->clients[i];
		priv->clients[i].prev_ptr = &priv->clients[i - 1].next;
	}

	priv->clients[i - 1].next = NULL;
	priv->idle_clients_tail_ptr = &priv->clients[i - 1].next;

	for (i = 0; i < priv->num_clients; i++) {
		priv->clients[i].control_port = "5199";
		priv->clients[i].data_port = "5198";
		priv->clients[i].ph = ph;
		ret = proxy_conn_init(&priv->clients[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy connection #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_conn_free(&priv->clients[i]);

			goto proxy_open_exit;
		}
	}

	for (i = 0; i < priv->num_clients; i++) {
		priv->client_workers[i].ph = ph;
		ret = proxy_worker_init(&priv->client_workers[i]);
		if (ret < 0) {
			proxy_log(ph, LOG_LEVEL_FATAL,
				  "Failed to initialize proxy client worker #%d (%d): %s\n",
				  i, -ret, strerror(-ret));

			for (i--; i >= 0; i--)
				proxy_worker_free(&priv->client_workers[i]);

			goto proxy_open_exit_late;
		}

		priv->client_workers[i].next = priv->idle_workers_head;
		priv->idle_workers_head = &priv->client_workers[i];
	}

	priv->conn_listen.source_addr = (const char *)ph->conf.bind_addr;
	priv->conn_listen.source_port = (const char *)priv->port_str;

	ret = conn_listen(&priv->conn_listen);
	if (ret < 0) {
		proxy_log(ph, LOG_LEVEL_FATAL,
			  "Failed to open listening port (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_open_exit_later;
	}

	if (ph->conf.bind_addr == NULL)
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections on port %s\n",
			  priv->port_str);
	else
		proxy_log(ph, LOG_LEVEL_INFO,
			  "Listening for connections at %s:%s\n",
			  ph->conf.bind_addr,
			  priv->port_str);

	return 0;

proxy_open_exit_later:
	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

proxy_open_exit_late:
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

proxy_open_exit:
	if (priv->re_calls_allowed != NULL) {
		regex_free(priv->re_calls_allowed);
		free(priv->re_calls_allowed);
		priv->re_calls_allowed = NULL;
	}

	log_close(&priv->log);

	free(priv->client_workers);
	priv->client_workers = NULL;

	free(priv->clients);
	priv->clients = NULL;

	priv->num_clients = 0;

	return ret;
}